

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3_174.c
# Opt level: O0

void OPL3_ChannelWriteC0(opl3_channel_conflict *channel,Bit8u data)

{
  Bit16u BVar1;
  Bit8u data_local;
  opl3_channel_conflict *channel_local;
  
  channel->fb = (Bit8u)((int)(data & 0xe) >> 1);
  channel->con = data & 1;
  channel->alg = channel->con;
  if (channel->chip->newm == '\0') {
    OPL3_ChannelSetupAlg(channel);
  }
  else if (channel->chtype == '\x01') {
    channel->pair->alg = channel->con << 1 | 4 | channel->pair->con;
    channel->alg = '\b';
    OPL3_ChannelSetupAlg(channel->pair);
  }
  else if (channel->chtype == '\x02') {
    channel->alg = channel->pair->con << 1 | 4 | channel->con;
    channel->pair->alg = '\b';
    OPL3_ChannelSetupAlg(channel);
  }
  else {
    OPL3_ChannelSetupAlg(channel);
  }
  if (channel->chip->newm == '\0') {
    channel->chb = 0xffff;
    channel->cha = 0xffff;
  }
  else {
    BVar1 = 0;
    if (((int)(uint)data >> 4 & 1U) != 0) {
      BVar1 = 0xffff;
    }
    channel->cha = BVar1;
    BVar1 = 0;
    if (((int)(uint)data >> 5 & 1U) != 0) {
      BVar1 = 0xffff;
    }
    channel->chb = BVar1;
  }
  return;
}

Assistant:

static void OPL3_ChannelWriteC0(opl3_channel *channel, Bit8u data)
{
    channel->fb = (data & 0x0e) >> 1;
    channel->con = data & 0x01;
    channel->alg = channel->con;
    if (channel->chip->newm)
    {
        if (channel->chtype == ch_4op)
        {
            channel->pair->alg = 0x04 | (channel->con << 1) | (channel->pair->con);
            channel->alg = 0x08;
            OPL3_ChannelSetupAlg(channel->pair);
        }
        else if (channel->chtype == ch_4op2)
        {
            channel->alg = 0x04 | (channel->pair->con << 1) | (channel->con);
            channel->pair->alg = 0x08;
            OPL3_ChannelSetupAlg(channel);
        }
        else
        {
            OPL3_ChannelSetupAlg(channel);
        }
    }
    else
    {
        OPL3_ChannelSetupAlg(channel);
    }
    if (channel->chip->newm)
    {
        channel->cha = ((data >> 4) & 0x01) ? ~0 : 0;
        channel->chb = ((data >> 5) & 0x01) ? ~0 : 0;
    }
    else
    {
        channel->cha = channel->chb = ~0;
    }
}